

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanLiteralContent(QXmlStreamReaderPrivate *this)

{
  uint ch;
  uint uVar1;
  uint uVar2;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  uint c;
  qsizetype n;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  long local_28;
  QXmlStreamReaderPrivate *this_00;
  QChar local_e;
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  this_00 = in_RDI;
  do {
    ch = getChar(this_00);
    if (ch == 0xffffffff) {
LAB_00655e8a:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_28;
    }
    uVar1 = ch & 0xffff;
    uVar2 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (uVar1 == 0) {
LAB_00655d18:
      putChar((QXmlStreamReaderPrivate *)(CONCAT44(ch,in_stack_ffffffffffffffc0) & 0xffffffffffff),
              uVar2);
      goto LAB_00655e8a;
    }
    if (uVar1 == 9) {
LAB_00655d81:
      if ((*(ushort *)&in_RDI->field_0x3a8 >> 5 & 1) == 0) {
        QChar::QChar<unsigned_int,_true>(&local_c,ch);
        QString::operator+=((QString *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                            (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      }
      else {
        QChar::QChar<char16_t,_true>(&local_a,L' ');
        QString::operator+=((QString *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                            (QChar)(char16_t)((ulong)in_RDI >> 0x30));
      }
    }
    else {
      if (uVar1 == 10) {
LAB_00655d55:
        in_RDI->lineNumber = in_RDI->lineNumber + 1;
        in_RDI->lastLineStart = in_RDI->characterOffset + in_RDI->readBufferPos;
        goto LAB_00655d81;
      }
      if (uVar1 == 0xd) {
        uVar2 = filterCarriageReturn(in_RDI);
        if (uVar2 != 0) goto LAB_00655d55;
        goto LAB_00655e8a;
      }
      if (uVar1 == 0x20) goto LAB_00655d81;
      if (((uVar1 == 0x22) || (uVar1 - 0x26 < 2)) || (uVar1 == 0x3c)) {
        if ((ch & 0xff0000) == 0) {
          putChar((QXmlStreamReaderPrivate *)
                  (CONCAT44(ch,in_stack_ffffffffffffffc0) & 0xffffffffffff),uVar2);
          goto LAB_00655e8a;
        }
      }
      else if (uVar1 == 0xfffe || uVar1 == 0xffff) goto LAB_00655d18;
      if (ch < 0x20) {
        putChar((QXmlStreamReaderPrivate *)(CONCAT44(ch,in_stack_ffffffffffffffc0) & 0xffffffffffff)
                ,uVar2);
        goto LAB_00655e8a;
      }
      QChar::QChar<unsigned_short,_true>(&local_e,(unsigned_short)ch);
      QString::operator+=((QString *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                          (QChar)(char16_t)((ulong)in_RDI >> 0x30));
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanLiteralContent()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            /* The putChar() call is necessary so the parser re-gets
             * the character from the input source, when raising an error. */
            putChar(c);
            return n;
        case '\r':
            if (filterCarriageReturn() == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            if (normalizeLiterals)
                textBuffer += u' ';
            else
                textBuffer += QChar(c);
            ++n;
            break;
        case '&':
        case '<':
        case '\"':
        case '\'':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}